

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint64_t t1ha_ia32aes_avx(void *data,size_t len,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  uint64_t uVar2;
  uint64_t uVar3;
  undefined1 (*pauVar4) [16];
  ulong in_RDX;
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint64_t *v;
  __m128i v1x;
  __m128i v0y;
  __m128i t;
  __m128i salt;
  __m128i *detent;
  __m128i *v_1;
  __m128i y;
  __m128i x;
  uint64_t b;
  uint64_t a;
  uint64_t in_stack_fffffffffffffb98;
  undefined1 (*local_450) [16];
  undefined1 in_stack_fffffffffffffbb8 [16];
  size_t tail;
  void *v_00;
  undefined1 in_stack_fffffffffffffbc8 [16];
  undefined1 local_418 [16];
  undefined1 (*local_400) [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3b8;
  undefined1 (*local_3b0) [16];
  ulong local_48;
  
  v_00 = in_stack_fffffffffffffbc8._0_8_;
  tail = in_stack_fffffffffffffbb8._8_8_;
  local_3d0 = in_RSI;
  local_3c8 = in_RDX;
  local_3b8 = in_RSI;
  local_3b0 = in_RDI;
  if (0x20 < in_RSI) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_RSI;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = in_RDX;
    local_3e8 = vpunpcklqdq_avx(auVar5,auVar6);
    auVar5 = vpunpcklqdq_avx(ZEXT816(0x82434fe90edcef39),ZEXT816(0xec99bf0d8372caab));
    local_3f8 = aesenc(local_3e8,auVar5);
    local_3b0 = (undefined1 (*) [16])(*in_RDI + (in_RSI & 0xfffffffffffffff0));
    local_400 = in_RDI;
    if ((in_RSI & 0x10) != 0) {
      local_400 = in_RDI + 1;
      local_3e8 = vpaddq_avx(local_3e8,*in_RDI);
      local_3f8 = aesenc(local_3e8,local_3f8);
    }
    local_3b8 = in_RSI & 0xf;
    if (local_400 + 7 < local_3b0) {
      local_418 = local_3f8;
      do {
        auVar5 = aesenc(*local_400,local_418);
        auVar5 = aesdec(auVar5,local_400[1]);
        auVar5 = aesdec(auVar5,local_400[2]);
        auVar5 = aesdec(auVar5,local_400[3]);
        auVar5 = aesdec(auVar5,local_400[4]);
        auVar5 = aesdec(auVar5,local_400[5]);
        auVar5 = aesdec(auVar5,local_400[6]);
        pauVar4 = local_400 + 8;
        auVar6 = aesdec(auVar5,local_400[7]);
        auVar5 = vpunpcklqdq_avx(ZEXT816(0xbd9cacc22c6e9571),ZEXT816(0xd4f06db99d67be4b));
        local_418 = vpaddq_avx(local_418,auVar5);
        auVar5 = aesenc(local_3e8,auVar6);
        local_3e8 = vpaddq_avx(local_3f8,local_3e8);
        pauVar1 = local_400 + 0xf;
        local_400 = pauVar4;
        local_3f8 = auVar5;
      } while (pauVar1 < local_3b0);
    }
    while( true ) {
      v_00 = in_stack_fffffffffffffbc8._0_8_;
      tail = in_stack_fffffffffffffbb8._8_8_;
      if (local_3b0 <= local_400) break;
      in_stack_fffffffffffffbc8 = vpaddq_avx(local_3f8,*local_400);
      in_stack_fffffffffffffbb8 = vpsubq_avx(local_3e8,local_400[1]);
      local_3e8 = aesdec(local_3e8,in_stack_fffffffffffffbc8);
      local_3f8 = aesdec(local_3f8,in_stack_fffffffffffffbb8);
      local_400 = local_400 + 2;
    }
    auVar5 = aesenc(local_3f8,local_3e8);
    auVar5 = aesdec(local_3e8,auVar5);
    auVar5 = vpaddq_avx(auVar5,local_3f8);
    local_3e8._0_8_ = auVar5._0_8_;
    local_3c8 = local_3e8._0_8_;
    auVar5 = vpunpckhqdq_avx(auVar5,auVar5);
    local_48 = auVar5._0_8_;
    local_3d0 = local_48;
  }
  local_450 = local_3b0;
  switch(local_3b8) {
  default:
    local_450 = (undefined1 (*) [16])(*local_3b0 + 8);
    uVar2 = mux64(*(uint64_t *)*local_3b0,0x9c06faf4d023e3ab);
    local_3d0 = uVar2 + local_3d0;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    uVar2 = mux64(*(uint64_t *)*local_450,0xbd9cacc22c6e9571);
    local_3c8 = uVar2 + local_3c8;
    local_450 = (undefined1 (*) [16])(*local_450 + 8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    uVar2 = mux64(*(uint64_t *)*local_450,0xd4f06db99d67be4b);
    local_3d0 = uVar2 + local_3d0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar2 = tail64_le(v_00,tail);
    uVar2 = mux64(uVar2,0x82434fe90edcef39);
    local_3c8 = uVar2 + local_3c8;
  case 0:
    uVar2 = rot64(local_3c8 + local_3d0,0x11);
    uVar2 = mux64(uVar2,0x9c06faf4d023e3ab);
    uVar3 = mix(uVar2,in_stack_fffffffffffffb98);
    return uVar2 + uVar3;
  }
}

Assistant:

static uint64_t __attribute__((target("aes,avx")))
t1ha_ia32aes_avx(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(p0, p1));

    const __m128i *v = (const __m128i *)data;
    const __m128i *const detent =
        (const __m128i *)((const uint8_t *)data + (len & ~15ul));
    data = detent;

    if (len & 16) {
      x = _mm_add_epi64(x, _mm_loadu_si128(v++));
      y = _mm_aesenc_si128(x, y);
    }
    len &= 15;

    if (v + 7 < detent) {
      __m128i salt = y;
      do {
        __m128i t = _mm_aesenc_si128(_mm_loadu_si128(v++), salt);
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        salt = _mm_add_epi64(salt, _mm_set_epi64x(p2, p3));
        t = _mm_aesenc_si128(x, t);
        x = _mm_add_epi64(y, x);
        y = t;
      } while (v + 7 < detent);
    }

    while (v < detent) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
    a = _mm_cvtsi128_si64(x);
#if defined(__SSE4_1__)
    b = _mm_extract_epi64(x, 1);
#else
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
#if defined(__SSE4_1__)
    a |= (uint64_t)_mm_extract_epi32(x, 1) << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) |
        (uint64_t)_mm_extract_epi32(x, 3) << 32;
#else
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    b += mux64(*v++, p4);
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    a += mux64(*v++, p3);
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    b += mux64(*v++, p2);
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    a += mux64(tail64_le(v, len), p1);
  case 0:
    return mux64(rot64(a + b, s1), p4) + mix(a ^ b, p0);
  }
}